

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,nop_statement_t *stmt)

{
  __shared_ptr<tchecker::typed_nop_statement_t,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<tchecker::typed_nop_statement_t,tchecker::statement_type_t>
            ((statement_type_t *)&local_20);
  std::__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_typed_stmt,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

virtual void visit(tchecker::nop_statement_t const & stmt)
  {
    _typed_stmt = std::make_shared<tchecker::typed_nop_statement_t>(tchecker::STMT_TYPE_NOP);
  }